

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map-util.h
# Opt level: O2

bool google::protobuf::
     InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>,std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*>
               (map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>_>
                *collection,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *key,FileDescriptorProto **value)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_bool>
  pVar1;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>
  local_40;
  
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>
  ::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_true>
            (&local_40,key,value);
  pVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>
          ::
          _M_insert_unique<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>
                    ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>
                      *)collection,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool InsertIfNotPresent(Collection * const collection,
                        const Key& key, const Value& value) {
  pair<typename Collection::iterator, bool> ret =
    collection->insert(typename Collection::value_type(key, value));
  return ret.second;
}